

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::loadModel(FastText *this,istream *in)

{
  element_type *peVar1;
  element_type *peVar2;
  int *in_RDI;
  istream *in_stack_00000038;
  Dictionary *in_stack_00000040;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff28;
  Model *in_stack_ffffffffffffff30;
  istream *in_stack_ffffffffffffff38;
  Matrix *in_stack_ffffffffffffff40;
  shared_ptr<fasttext::Args> *in_stack_ffffffffffffff58;
  shared_ptr<fasttext::Matrix> *in_stack_ffffffffffffff60;
  shared_ptr<fasttext::Matrix> *in_stack_ffffffffffffff68;
  entry_type in_stack_ffffffffffffff77;
  Dictionary *in_stack_ffffffffffffff78;
  Args *in_stack_ffffffffffffff80;
  
  std::make_shared<fasttext::Args>();
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_ffffffffffffff30,
             (shared_ptr<fasttext::Args> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x153420);
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>(in_stack_ffffffffffffff58)
  ;
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_ffffffffffffff30,
             (shared_ptr<fasttext::Dictionary> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x153455);
  std::make_shared<fasttext::Matrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            (&in_stack_ffffffffffffff30->wi_,
             (shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x153485);
  std::make_shared<fasttext::Matrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            (&in_stack_ffffffffffffff30->wi_,
             (shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x1534b5);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1534bf);
  Args::load(in_stack_ffffffffffffff80,(istream *)in_stack_ffffffffffffff78);
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1534dd);
  Dictionary::load(in_stack_00000040,in_stack_00000038);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1534fb);
  Matrix::load(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x153519);
  Matrix::load(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_RDI);
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)in_stack_ffffffffffffff30,
             (shared_ptr<fasttext::Model> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x153570);
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15357a);
  if (peVar1->model == sup) {
    peVar2 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x153591);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1535a4);
    Dictionary::getCounts(in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
    Model::setTargetCounts(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)peVar2)
    ;
  }
  else {
    peVar2 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x153603);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x153616);
    Dictionary::getCounts(in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
    Model::setTargetCounts(peVar2,in_stack_ffffffffffffff28);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void FastText::loadModel(std::istream& in) {
  args_ = std::make_shared<Args>();
  dict_ = std::make_shared<Dictionary>(args_);
  input_ = std::make_shared<Matrix>();
  output_ = std::make_shared<Matrix>();
  args_->load(in);
  dict_->load(in);
  input_->load(in);
  output_->load(in);
  model_ = std::make_shared<Model>(input_, output_, args_, 0);
  if (args_->model == model_name::sup) {
    model_->setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model_->setTargetCounts(dict_->getCounts(entry_type::word));
  }
}